

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int ark_MRIStepInnerEvolve(MRIStepInnerStepper stepper,sunrealtype t0,sunrealtype tout,N_Vector y)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void *arkode_mem;
  int nforcing;
  sunrealtype local_50;
  N_Vector *forcing;
  sunrealtype tscale;
  sunrealtype tshift;
  sunrealtype tret;
  
  local_50 = tout;
  iVar2 = MRIStepInnerStepper_GetContent(stepper,&arkode_mem);
  pvVar1 = arkode_mem;
  uVar4 = 0xffffffff;
  if (iVar2 == 0) {
    if (arkode_mem == (void *)0x0) {
      arkProcessError((ARKodeMem)0x0,-0x15,0xef8,"ark_MRIStepInnerEvolve",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"arkode_mem = NULL illegal.");
    }
    else {
      iVar2 = MRIStepInnerStepper_GetForcingData(stepper,&tshift,&tscale,&forcing,&nforcing);
      if (iVar2 == 0) {
        iVar2 = (**(code **)((long)pvVar1 + 0x228))(tshift,tscale,pvVar1,forcing,nforcing);
        if (iVar2 == 0) {
          iVar2 = ARKodeSetStopTime(arkode_mem,local_50);
          if (iVar2 == 0) {
            iVar2 = ARKodeEvolve(arkode_mem,local_50,y,&tret,1);
            uVar3 = 0;
            if ((-1 < iVar2) || ((iVar2 + 4U < 4 && (uVar3 = 1, iVar2 + 4U != 2)))) {
              iVar2 = (**(code **)((long)pvVar1 + 0x228))(0,0x3ff0000000000000,pvVar1,0,0);
              uVar4 = -(uint)(iVar2 != 0) | uVar3;
            }
          }
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int ark_MRIStepInnerEvolve(MRIStepInnerStepper stepper,
                           SUNDIALS_MAYBE_UNUSED sunrealtype t0,
                           sunrealtype tout, N_Vector y)
{
  void* arkode_mem; /* arkode memory             */
  ARKodeMem ark_mem;
  sunrealtype tret;           /* return time               */
  sunrealtype tshift, tscale; /* time normalization values */
  N_Vector* forcing;          /* forcing vectors           */
  int nforcing;               /* number of forcing vectors */
  int retval;                 /* return value              */

  /* extract the ARKODE memory struct */
  retval = MRIStepInnerStepper_GetContent(stepper, &arkode_mem);
  if (retval != ARK_SUCCESS) { return -1; }
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return -1;
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* get the forcing data */
  retval = MRIStepInnerStepper_GetForcingData(stepper, &tshift, &tscale,
                                              &forcing, &nforcing);
  if (retval != ARK_SUCCESS) { return -1; }

  /* set the inner forcing data */
  retval = ark_mem->step_setforcing(ark_mem, tshift, tscale, forcing, nforcing);
  if (retval != ARK_SUCCESS) { return -1; }

  /* set the stop time */
  retval = ARKodeSetStopTime(arkode_mem, tout);
  if (retval != ARK_SUCCESS) { return -1; }

  /* evolve inner ODE, consider all positive return values as 'success' */
  retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);
  if (retval > 0) { retval = 0; }

  /* set a recoverable failure for a few ARKODE failure modes;
     on other ARKODE errors return with an unrecoverable failure */
  if (retval < 0)
  {
    if ((retval == ARK_TOO_MUCH_WORK) || (retval == ARK_CONV_FAILURE) ||
        (retval == ARK_ERR_FAILURE))
    {
      retval = 1;
    }
    else { return -1; }
  }

  /* disable inner forcing */
  if (ark_mem->step_setforcing(ark_mem, ZERO, ONE, NULL, 0) != ARK_SUCCESS)
  {
    return -1;
  }

  return retval;
}